

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O1

void __thiscall duckdb::CSVErrorHandler::ErrorIfAny(CSVErrorHandler *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  InternalException *this_00;
  string local_48;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  if ((this->ignore_errors == false) &&
     ((this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
      super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
      super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pvVar3 = vector<duckdb::CSVError,_true>::operator[](&this->errors,0);
    bVar1 = CanGetLine(this,(pvVar3->error_info).boundary_idx);
    if (bVar1) {
      pvVar3 = vector<duckdb::CSVError,_true>::operator[](&this->errors,0);
      ThrowError(this,pvVar3);
    }
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Failed to get error information for boundary index","");
    InternalException::InternalException(this_00,&local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void CSVErrorHandler::ErrorIfAny() {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (ignore_errors || errors.empty()) {
		// Nothing to error
		return;
	}
	if (!CanGetLine(errors[0].error_info.boundary_idx)) {
		throw InternalException("Failed to get error information for boundary index");
	}
	ThrowError(errors[0]);
}